

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O2

bool __thiscall
wasm::ExpressionAnalyzer::flexibleEqual(wasm::Expression*,wasm::Expression*,std::function<bool(wasm
::Expression*,wasm::Expression*)>)::Comparer::compareNodes(wasm::Expression*,wasm::Expression__
          (void *this,Expression *left,Expression *right)

{
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar1;
  ArenaVectorBase<ArenaVector<bool>,_bool> *this_00;
  Expression *pEVar2;
  uchar *puVar3;
  uchar *puVar4;
  ArenaVector<wasm::Expression_*> *pAVar5;
  string_view sVar6;
  bool bVar7;
  Resume *pRVar8;
  Resume *pRVar9;
  StackSwitch *pSVar10;
  StackSwitch *pSVar11;
  Expression **ppEVar12;
  StringNew *pSVar13;
  StringNew *pSVar14;
  SIMDReplace *pSVar15;
  SIMDReplace *pSVar16;
  StructCmpxchg *pSVar17;
  StructCmpxchg *pSVar18;
  ContBind *pCVar19;
  ContBind *pCVar20;
  RefTest *pRVar21;
  ArrayCopy *pAVar22;
  CallRef *pCVar23;
  CallRef *pCVar24;
  Rethrow *pRVar25;
  Rethrow *pRVar26;
  SIMDShuffle *pSVar27;
  SIMDShuffle *pSVar28;
  Const *pCVar29;
  Const *pCVar30;
  LocalGet *pLVar31;
  LocalGet *pLVar32;
  RefAs *pRVar33;
  Call *pCVar34;
  ExpressionList *pEVar35;
  ArrayInitData *pAVar36;
  ArrayInitData *pAVar37;
  TupleExtract *pTVar38;
  TupleExtract *pTVar39;
  TryTable *pTVar40;
  TryTable *pTVar41;
  Load *pLVar42;
  Load *pLVar43;
  CallIndirect *pCVar44;
  CallIndirect *pCVar45;
  Try *pTVar46;
  Try *pTVar47;
  Break *pBVar48;
  Break *pBVar49;
  Switch *pSVar50;
  Switch *pSVar51;
  MemoryGrow *pMVar52;
  MemoryGrow *pMVar53;
  StructRMW *pSVar54;
  StructRMW *pSVar55;
  I31Get *pIVar56;
  I31Get *pIVar57;
  StructNew *pSVar58;
  StructNew *pSVar59;
  BrOn *pBVar60;
  BrOn *pBVar61;
  Block *pBVar62;
  Block *pBVar63;
  Store *pSVar64;
  Store *pSVar65;
  StructGet *pSVar66;
  StructGet *pSVar67;
  AtomicRMW *pAVar68;
  AtomicRMW *pAVar69;
  TableFill *pTVar70;
  TableFill *pTVar71;
  SIMDTernary *pSVar72;
  SIMDTernary *pSVar73;
  AtomicFence *pAVar74;
  AtomicFence *pAVar75;
  SIMDLoadStoreLane *pSVar76;
  SIMDLoadStoreLane *pSVar77;
  MemoryCopy *pMVar78;
  MemoryCopy *pMVar79;
  ArrayCopy *pAVar80;
  ResumeThrow *pRVar81;
  ResumeThrow *pRVar82;
  Type *pTVar83;
  Type *pTVar84;
  TupleMake *pTVar85;
  TupleMake *pTVar86;
  GlobalGet *pGVar87;
  GlobalGet *pGVar88;
  ArrayNewFixed *pAVar89;
  ArrayNewFixed *pAVar90;
  MixedArena *pMVar91;
  bool *pbVar92;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *pAVar93;
  Name *pNVar94;
  mapped_type *pmVar95;
  Name *pNVar96;
  long lVar97;
  char *pcVar98;
  uint uVar99;
  char *pcVar100;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar101;
  size_t sVar102;
  char *in_R8;
  ExpressionList *__range4;
  ulong uVar103;
  ExpressionList *__range4_4;
  ExpressionList *__range4_2;
  ExpressionList *__range4_6;
  Name left_00;
  Name right_00;
  Name right_01;
  Name right_02;
  Name right_03;
  Name right_04;
  Name right_05;
  Name right_06;
  Name right_07;
  ExpressionList *__range4_3;
  ExpressionList *__range4_15;
  Expression *child;
  Iterator __begin4;
  ExpressionList *__range4_1;
  
  if (left->_id != right->_id) {
    return false;
  }
  switch(left->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    pBVar62 = Expression::cast<wasm::Block>(left);
    pBVar63 = Expression::cast<wasm::Block>(right);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pBVar62->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 != (ArenaVector<wasm::Expression_*> *)
                  (pBVar63->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      return false;
    }
    __begin4.index = (size_t)&pBVar63->list;
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    child = (Expression *)&pBVar62->list;
    while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pBVar62->list))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    child = (Expression *)__begin4.index;
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pBVar63->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    while ((__begin4.parent != pAVar5 || (child != (Expression *)__begin4.index))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    if (((pBVar63->name).super_IString.str._M_str != (char *)0x0) !=
        ((pBVar62->name).super_IString.str._M_str != (char *)0x0)) {
      return false;
    }
    goto LAB_0089d656;
  case IfId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::If>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::If>(right);
    goto LAB_0089d133;
  case LoopId:
    pBVar62 = (Block *)Expression::cast<wasm::Loop>(left);
    pBVar63 = (Block *)Expression::cast<wasm::Loop>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&pBVar62->list);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&pBVar63->list);
    if (((pBVar63->name).super_IString.str._M_str != (char *)0x0) !=
        ((pBVar62->name).super_IString.str._M_str != (char *)0x0)) {
      return false;
    }
LAB_0089d656:
    pmVar95 = std::
              map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                            *)this,&pBVar62->name);
    pcVar100 = (pBVar63->name).super_IString.str._M_str;
    (pmVar95->super_IString).str._M_len = (pBVar63->name).super_IString.str._M_len;
    (pmVar95->super_IString).str._M_str = pcVar100;
    return true;
  case BreakId:
    pBVar48 = Expression::cast<wasm::Break>(left);
    pBVar49 = Expression::cast<wasm::Break>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar48->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pBVar49->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar48->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pBVar49->value);
    sVar102 = (pBVar48->name).super_IString.str._M_len;
    pcVar100 = (pBVar48->name).super_IString.str._M_str;
    pcVar98 = (pBVar49->name).super_IString.str._M_str;
    goto LAB_0089c52e;
  case SwitchId:
    pSVar50 = Expression::cast<wasm::Switch>(left);
    pSVar51 = Expression::cast<wasm::Switch>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar50->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar51->condition);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar50->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar51->value);
    right_02.super_IString.str._M_str = in_R8;
    right_02.super_IString.str._M_len = (size_t)(pSVar51->default_).super_IString.str._M_str;
    bVar7 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pSVar50->default_).super_IString.str,right_02);
    if (bVar7) {
      uVar99 = 0;
      if ((pSVar50->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          != (pSVar51->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
             usedElements) {
        return false;
      }
      __begin4.index = (size_t)&pSVar51->targets;
      do {
        uVar103 = (ulong)uVar99;
        if ((pSVar50->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
            usedElements <= uVar103) {
          return true;
        }
        pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pSVar50->targets).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
        sVar6 = (pNVar94->super_IString).str;
        pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)__begin4.index,
                             uVar103);
        right_03.super_IString.str._M_str = in_R8;
        right_03.super_IString.str._M_len = (size_t)(pNVar94->super_IString).str._M_str;
        bVar7 = compareNames(wasm::Name,wasm::Name_(this,(Name)sVar6,right_03);
        uVar99 = uVar99 + 1;
      } while (bVar7);
      return false;
    }
    break;
  case CallId:
    pCVar34 = Expression::cast<wasm::Call>(left);
    __begin4.index = (size_t)Expression::cast<wasm::Call>(right);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pCVar34->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (((Call *)__begin4.index)->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      pEVar35 = &((Call *)__begin4.index)->operands;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pCVar34->operands;
      while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pCVar34->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = *(ArenaVector<wasm::Expression_*> **)(__begin4.index + 0x18);
      child = (Expression *)pEVar35;
      while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != pEVar35))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      if (((pCVar34->target).super_IString.str._M_str == *(char **)(__begin4.index + 0x38)) &&
         (pCVar34->isReturn == (bool)*(char *)(__begin4.index + 0x40))) {
        return true;
      }
    }
    break;
  case CallIndirectId:
    pCVar44 = Expression::cast<wasm::CallIndirect>(left);
    pCVar45 = Expression::cast<wasm::CallIndirect>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pCVar44->target);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pCVar45->target);
    if (((pCVar44->table).super_IString.str._M_str == (pCVar45->table).super_IString.str._M_str) &&
       (pAVar5 = (ArenaVector<wasm::Expression_*> *)
                 (pCVar44->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements,
       pAVar5 == (ArenaVector<wasm::Expression_*> *)
                 (pCVar45->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements)) {
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pCVar44->operands;
      __begin4.index = (size_t)pCVar45;
      while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pCVar44->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = *(ArenaVector<wasm::Expression_*> **)(__begin4.index + 0x20);
      child = (Expression *)&pCVar45->operands;
      while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pCVar45->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      if (((pCVar44->heapType).id == *(uintptr_t *)(__begin4.index + 0x10)) &&
         (pCVar44->isReturn == (bool)*(char *)(__begin4.index + 0x50))) {
        return true;
      }
    }
    break;
  case LocalGetId:
    pLVar31 = Expression::cast<wasm::LocalGet>(left);
    pLVar32 = Expression::cast<wasm::LocalGet>(right);
    if (pLVar31->index == pLVar32->index) {
      return true;
    }
    break;
  case LocalSetId:
    pSVar72 = (SIMDTernary *)Expression::cast<wasm::LocalSet>(left);
    pSVar73 = (SIMDTernary *)Expression::cast<wasm::LocalSet>(right);
    goto LAB_0089c4bb;
  case GlobalGetId:
    pGVar87 = Expression::cast<wasm::GlobalGet>(left);
    pGVar88 = Expression::cast<wasm::GlobalGet>(right);
    goto LAB_0089d382;
  case GlobalSetId:
    pTVar70 = (TableFill *)Expression::cast<wasm::GlobalSet>(left);
    pTVar71 = (TableFill *)Expression::cast<wasm::GlobalSet>(right);
    goto LAB_0089c8cb;
  case LoadId:
    pLVar42 = Expression::cast<wasm::Load>(left);
    pLVar43 = Expression::cast<wasm::Load>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pLVar42->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pLVar43->ptr);
    if (pLVar42->bytes != pLVar43->bytes) {
      return false;
    }
    if (pLVar42->signed_ != pLVar43->signed_) {
      return false;
    }
    if ((pLVar42->offset).addr != (pLVar43->offset).addr) {
      return false;
    }
    if ((pLVar42->align).addr != (pLVar43->align).addr) {
      return false;
    }
    if (pLVar42->isAtomic != pLVar43->isAtomic) {
      return false;
    }
    goto LAB_0089cfd3;
  case StoreId:
    pSVar64 = Expression::cast<wasm::Store>(left);
    pSVar65 = Expression::cast<wasm::Store>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar64->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar65->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar64->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar65->ptr);
    if (((pSVar64->bytes == pSVar65->bytes) && ((pSVar64->offset).addr == (pSVar65->offset).addr))
       && (((pSVar64->align).addr == (pSVar65->align).addr &&
           (((pSVar64->isAtomic == pSVar65->isAtomic &&
             ((pSVar64->valueType).id == (pSVar65->valueType).id)) &&
            ((pSVar64->memory).super_IString.str._M_str ==
             (pSVar65->memory).super_IString.str._M_str)))))) {
      return true;
    }
    break;
  case ConstId:
    pCVar29 = Expression::cast<wasm::Const>(left);
    pCVar30 = Expression::cast<wasm::Const>(right);
    bVar7 = Literal::operator!=(&pCVar29->value,&pCVar30->value);
    if (!bVar7) {
      return true;
    }
    break;
  case UnaryId:
    pSVar72 = (SIMDTernary *)Expression::cast<wasm::Unary>(left);
    pSVar73 = (SIMDTernary *)Expression::cast<wasm::Unary>(right);
LAB_0089c4bb:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar72->a);
LAB_0089ce46:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar73->a);
    if (pSVar72->op == pSVar73->op) {
      return true;
    }
    break;
  case BinaryId:
    pSVar72 = (SIMDTernary *)Expression::cast<wasm::Binary>(left);
    pSVar73 = (SIMDTernary *)Expression::cast<wasm::Binary>(right);
    goto LAB_0089ce17;
  case SelectId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::Select>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::Select>(right);
    goto LAB_0089d133;
  case DropId:
    pRVar21 = (RefTest *)Expression::cast<wasm::Drop>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::Drop>(right);
    goto LAB_0089cb59;
  case ReturnId:
    pRVar21 = (RefTest *)Expression::cast<wasm::Return>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::Return>(right);
    goto LAB_0089cb59;
  case MemorySizeId:
    pGVar87 = (GlobalGet *)Expression::cast<wasm::MemorySize>(left);
    pGVar88 = (GlobalGet *)Expression::cast<wasm::MemorySize>(right);
    goto LAB_0089d382;
  case MemoryGrowId:
    pMVar52 = Expression::cast<wasm::MemoryGrow>(left);
    pMVar53 = Expression::cast<wasm::MemoryGrow>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar52->delta);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar53->delta);
    if ((pMVar52->memory).super_IString.str._M_str == (pMVar53->memory).super_IString.str._M_str) {
      return true;
    }
    break;
  case NopId:
    Expression::cast<wasm::Nop>(left);
    Expression::cast<wasm::Nop>(right);
    return true;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(left);
    Expression::cast<wasm::Unreachable>(right);
    return true;
  case AtomicRMWId:
    pAVar68 = Expression::cast<wasm::AtomicRMW>(left);
    pAVar69 = Expression::cast<wasm::AtomicRMW>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar68->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar69->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar68->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar69->ptr);
    if (pAVar68->op != pAVar69->op) {
      return false;
    }
    if (pAVar68->bytes != pAVar69->bytes) {
      return false;
    }
    if ((pAVar68->offset).addr != (pAVar69->offset).addr) {
      return false;
    }
    goto LAB_0089cd4c;
  case AtomicCmpxchgId:
    pLVar42 = (Load *)Expression::cast<wasm::AtomicCmpxchg>(left);
    pLVar43 = (Load *)Expression::cast<wasm::AtomicCmpxchg>(right);
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pLVar42->ptr);
    pvVar101 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pLVar43->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&pLVar42->isAtomic);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,(value_type *)&pLVar43->isAtomic);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&pLVar42->align);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,(value_type *)&pLVar43->align);
    if (pLVar42->bytes != pLVar43->bytes) {
      return false;
    }
    goto LAB_0089cfc5;
  case AtomicWaitId:
    pLVar42 = (Load *)Expression::cast<wasm::AtomicWait>(left);
    pLVar43 = (Load *)Expression::cast<wasm::AtomicWait>(right);
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&pLVar42->isAtomic);
    pvVar101 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,(value_type *)&pLVar43->isAtomic);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&pLVar42->align);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,(value_type *)&pLVar43->align);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&pLVar42->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,(value_type *)&pLVar43->offset);
    if (*(long *)&pLVar42->bytes != *(long *)&pLVar43->bytes) {
      return false;
    }
    if (pLVar42->ptr != pLVar43->ptr) {
      return false;
    }
    goto LAB_0089cfd3;
  case AtomicNotifyId:
    pMVar78 = (MemoryCopy *)Expression::cast<wasm::AtomicNotify>(left);
    pMVar79 = (MemoryCopy *)Expression::cast<wasm::AtomicNotify>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar78->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar79->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pMVar78->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pMVar79->source);
    if (pMVar78->dest != pMVar79->dest) {
      return false;
    }
    goto LAB_0089d05a;
  case AtomicFenceId:
    pAVar74 = Expression::cast<wasm::AtomicFence>(left);
    pAVar75 = Expression::cast<wasm::AtomicFence>(right);
    if (pAVar74->order == pAVar75->order) {
      return true;
    }
    break;
  case SIMDExtractId:
    pSVar15 = (SIMDReplace *)Expression::cast<wasm::SIMDExtract>(left);
    pSVar16 = (SIMDReplace *)Expression::cast<wasm::SIMDExtract>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar15->vec);
    goto LAB_0089be87;
  case SIMDReplaceId:
    pSVar15 = Expression::cast<wasm::SIMDReplace>(left);
    pSVar16 = Expression::cast<wasm::SIMDReplace>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar15->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar16->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar15->vec);
LAB_0089be87:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar16->vec);
    if (pSVar15->op == pSVar16->op) {
LAB_0089bea1:
      if (pSVar15->index == pSVar16->index) {
        return true;
      }
    }
    break;
  case SIMDShuffleId:
    pSVar27 = Expression::cast<wasm::SIMDShuffle>(left);
    pSVar28 = Expression::cast<wasm::SIMDShuffle>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar27->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar28->right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar27->left);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar28->left);
    lVar97 = 0;
    do {
      if (lVar97 == 0x10) {
        return true;
      }
      puVar3 = (pSVar27->mask)._M_elems + lVar97;
      puVar4 = (pSVar28->mask)._M_elems + lVar97;
      lVar97 = lVar97 + 1;
    } while (*puVar3 == *puVar4);
    return false;
  case SIMDTernaryId:
    pSVar72 = Expression::cast<wasm::SIMDTernary>(left);
    pSVar73 = Expression::cast<wasm::SIMDTernary>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar72->c);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar73->c);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar72->b);
    goto LAB_0089ce2e;
  case SIMDShiftId:
    pSVar72 = (SIMDTernary *)Expression::cast<wasm::SIMDShift>(left);
    pSVar73 = (SIMDTernary *)Expression::cast<wasm::SIMDShift>(right);
LAB_0089ce17:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar72->b);
LAB_0089ce2e:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar73->b);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar72->a);
    goto LAB_0089ce46;
  case SIMDLoadId:
    pAVar68 = (AtomicRMW *)Expression::cast<wasm::SIMDLoad>(left);
    pAVar69 = (AtomicRMW *)Expression::cast<wasm::SIMDLoad>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar68->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar69->value);
    if (pAVar68->op != pAVar69->op) {
      return false;
    }
    if ((pAVar68->offset).addr != (pAVar69->offset).addr) {
      return false;
    }
    if (pAVar68->ptr != pAVar69->ptr) {
      return false;
    }
LAB_0089cd4c:
    if ((pAVar68->memory).super_IString.str._M_str == (pAVar69->memory).super_IString.str._M_str) {
      return true;
    }
    break;
  case SIMDLoadStoreLaneId:
    pSVar76 = Expression::cast<wasm::SIMDLoadStoreLane>(left);
    pSVar77 = Expression::cast<wasm::SIMDLoadStoreLane>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar76->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar77->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar76->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar77->ptr);
    if ((((pSVar76->op == pSVar77->op) && ((pSVar76->offset).addr == (pSVar77->offset).addr)) &&
        ((pSVar76->align).addr == (pSVar77->align).addr)) &&
       ((pSVar76->index == pSVar77->index &&
        ((pSVar76->memory).super_IString.str._M_str == (pSVar77->memory).super_IString.str._M_str)))
       ) {
      return true;
    }
    break;
  case MemoryInitId:
    pLVar42 = (Load *)Expression::cast<wasm::MemoryInit>(left);
    pLVar43 = (Load *)Expression::cast<wasm::MemoryInit>(right);
    goto LAB_0089cf72;
  case DataDropId:
    pGVar87 = (GlobalGet *)Expression::cast<wasm::DataDrop>(left);
    pGVar88 = (GlobalGet *)Expression::cast<wasm::DataDrop>(right);
    goto LAB_0089d382;
  case MemoryCopyId:
    pMVar78 = Expression::cast<wasm::MemoryCopy>(left);
    pMVar79 = Expression::cast<wasm::MemoryCopy>(right);
    goto LAB_0089cff9;
  case MemoryFillId:
    pMVar78 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(left);
    pMVar79 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(right);
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pMVar78->size);
    pvVar101 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pMVar79->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pMVar78->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pMVar79->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pMVar78->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pMVar79->dest);
    goto LAB_0089d05a;
  case PopId:
    Expression::cast<wasm::Pop>(left);
    Expression::cast<wasm::Pop>(right);
    return true;
  case RefNullId:
    Expression::cast<wasm::RefNull>(left);
    Expression::cast<wasm::RefNull>(right);
    return true;
  case RefIsNullId:
    pRVar21 = (RefTest *)Expression::cast<wasm::RefIsNull>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::RefIsNull>(right);
    goto LAB_0089cb59;
  case RefFuncId:
    pGVar87 = (GlobalGet *)Expression::cast<wasm::RefFunc>(left);
    pGVar88 = (GlobalGet *)Expression::cast<wasm::RefFunc>(right);
    goto LAB_0089d382;
  case RefEqId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::RefEq>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::RefEq>(right);
    goto LAB_0089d104;
  case TableGetId:
    pTVar70 = (TableFill *)Expression::cast<wasm::TableGet>(left);
    pTVar71 = (TableFill *)Expression::cast<wasm::TableGet>(right);
LAB_0089c8cb:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar70->dest);
LAB_0089cde5:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar71->dest);
    if ((pTVar70->table).super_IString.str._M_str == (pTVar71->table).super_IString.str._M_str) {
      return true;
    }
    break;
  case TableSetId:
    pTVar70 = (TableFill *)Expression::cast<wasm::TableSet>(left);
    pTVar71 = (TableFill *)Expression::cast<wasm::TableSet>(right);
    goto LAB_0089cd72;
  case TableSizeId:
    pGVar87 = (GlobalGet *)Expression::cast<wasm::TableSize>(left);
    pGVar88 = (GlobalGet *)Expression::cast<wasm::TableSize>(right);
    goto LAB_0089d382;
  case TableGrowId:
    pTVar70 = (TableFill *)Expression::cast<wasm::TableGrow>(left);
    pTVar71 = (TableFill *)Expression::cast<wasm::TableGrow>(right);
LAB_0089cd72:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar70->value);
LAB_0089cdcd:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar71->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar70->dest);
    goto LAB_0089cde5;
  case TableFillId:
    pTVar70 = Expression::cast<wasm::TableFill>(left);
    pTVar71 = Expression::cast<wasm::TableFill>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar70->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar71->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar70->value);
    goto LAB_0089cdcd;
  case TableCopyId:
    pMVar78 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(left);
    pMVar79 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(right);
LAB_0089cff9:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pMVar78->size);
    pvVar101 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pMVar79->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pMVar78->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pMVar79->source);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pMVar78->dest);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pMVar79->dest);
    if ((pMVar78->sourceMemory).super_IString.str._M_str !=
        (pMVar79->sourceMemory).super_IString.str._M_str) {
      return false;
    }
LAB_0089d05a:
    if ((pMVar78->destMemory).super_IString.str._M_str ==
        (pMVar79->destMemory).super_IString.str._M_str) {
      return true;
    }
    break;
  case TableInitId:
    pLVar42 = (Load *)Expression::cast<wasm::TableInit>(left);
    pLVar43 = (Load *)Expression::cast<wasm::TableInit>(right);
LAB_0089cf72:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pLVar42->ptr);
    pvVar101 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,&pLVar43->ptr);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&pLVar42->isAtomic);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,(value_type *)&pLVar43->isAtomic);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&pLVar42->align);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar101,(value_type *)&pLVar43->align);
LAB_0089cfc5:
    if ((pLVar42->offset).addr != (pLVar43->offset).addr) {
      return false;
    }
LAB_0089cfd3:
    if ((pLVar42->memory).super_IString.str._M_str == (pLVar43->memory).super_IString.str._M_str) {
      return true;
    }
    break;
  case TryId:
    pTVar46 = Expression::cast<wasm::Try>(left);
    pTVar47 = Expression::cast<wasm::Try>(right);
    right_00.super_IString.str._M_str = in_R8;
    right_00.super_IString.str._M_len = (size_t)(pTVar47->delegateTarget).super_IString.str._M_str;
    bVar7 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pTVar46->delegateTarget).super_IString.str,right_00);
    if (!bVar7) {
      return false;
    }
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pTVar46->catchBodies).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 != (ArenaVector<wasm::Expression_*> *)
                  (pTVar47->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      return false;
    }
    __begin4.index = (long)this + 0x30;
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    child = (Expression *)&pTVar46->catchBodies;
    while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pTVar46->catchBodies))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)__begin4.index,
                 (value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pTVar47->catchBodies).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    child = (Expression *)&pTVar47->catchBodies;
    while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pTVar47->catchBodies))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    uVar99 = 0;
    if ((pTVar46->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
        != (pTVar47->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
           usedElements) {
      return false;
    }
    while (uVar103 = (ulong)uVar99,
          uVar103 < (pTVar46->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                    usedElements) {
      pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(pTVar46->catchTags).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
      pNVar96 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(pTVar47->catchTags).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
      uVar99 = uVar99 + 1;
      if ((pNVar94->super_IString).str._M_str != (pNVar96->super_IString).str._M_str) {
        return false;
      }
    }
    if (((pTVar47->name).super_IString.str._M_str != (char *)0x0) !=
        ((pTVar46->name).super_IString.str._M_str != (char *)0x0)) {
      return false;
    }
    pmVar95 = std::
              map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                            *)this,&pTVar46->name);
    pcVar100 = (pTVar47->name).super_IString.str._M_str;
    (pmVar95->super_IString).str._M_len = (pTVar47->name).super_IString.str._M_len;
    (pmVar95->super_IString).str._M_str = pcVar100;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)__begin4.index,
               &pTVar46->body);
    ppEVar12 = &pTVar47->body;
    goto LAB_0089d274;
  case TryTableId:
    pTVar40 = Expression::cast<wasm::TryTable>(left);
    pTVar41 = Expression::cast<wasm::TryTable>(right);
    uVar99 = 0;
    if ((pTVar40->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements
        != (pTVar41->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.
           usedElements) {
      return false;
    }
    __begin4.index = (size_t)pTVar40;
    while (uVar103 = (ulong)uVar99, uVar103 < *(ulong *)(__begin4.index + 0x80)) {
      pTVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                          (&(pTVar40->sentTypes).
                            super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,uVar103);
      pTVar84 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                          (&(pTVar41->sentTypes).
                            super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,uVar103);
      uVar99 = uVar99 + 1;
      if (pTVar83->id != pTVar84->id) {
        return false;
      }
    }
    uVar99 = 0;
    if (*(size_t *)(__begin4.index + 0x60) !=
        (pTVar41->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements) {
      return false;
    }
    this_00 = (ArenaVectorBase<ArenaVector<bool>,_bool> *)(__begin4.index + 0x58);
    while (uVar103 = (ulong)uVar99, uVar103 < *(ulong *)(__begin4.index + 0x60)) {
      pbVar92 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[](this_00,uVar103);
      bVar7 = *pbVar92;
      pbVar92 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                          (&(pTVar41->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                           uVar103);
      uVar99 = uVar99 + 1;
      if (bVar7 != *pbVar92) {
        return false;
      }
    }
    uVar99 = 0;
    if (*(size_t *)(__begin4.index + 0x40) !=
        (pTVar41->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
        usedElements) {
      return false;
    }
    pAVar93 = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(__begin4.index + 0x38);
    while (uVar103 = (ulong)uVar99, uVar103 < *(ulong *)(__begin4.index + 0x40)) {
      pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[](pAVar93,uVar103);
      sVar6 = (pNVar94->super_IString).str;
      pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(pTVar41->catchDests).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
      right_07.super_IString.str._M_str = in_R8;
      right_07.super_IString.str._M_len = (size_t)(pNVar94->super_IString).str._M_str;
      bVar7 = compareNames(wasm::Name,wasm::Name_(this,(Name)sVar6,right_07);
      uVar99 = uVar99 + 1;
      if (!bVar7) {
        return false;
      }
    }
    uVar99 = 0;
    if (*(size_t *)(__begin4.index + 0x20) !=
        (pTVar41->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
       ) {
      return false;
    }
    pAVar93 = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(__begin4.index + 0x18);
    while (uVar103 = (ulong)uVar99, uVar103 < *(ulong *)(__begin4.index + 0x20)) {
      pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[](pAVar93,uVar103);
      pNVar96 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(pTVar41->catchTags).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
      uVar99 = uVar99 + 1;
      if ((pNVar94->super_IString).str._M_str != (pNVar96->super_IString).str._M_str) {
        return false;
      }
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(__begin4.index + 0x10));
    ppEVar12 = &pTVar41->body;
    goto LAB_0089d274;
  case ThrowId:
    __range4_3 = (ExpressionList *)Expression::cast<wasm::Throw>(left);
    __begin4.index = (size_t)Expression::cast<wasm::Throw>(right);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (((Throw *)__range4_3)->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 != (ArenaVector<wasm::Expression_*> *)
                  (((Throw *)__begin4.index)->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      return false;
    }
    pEVar35 = &((Throw *)__begin4.index)->operands;
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    child = (Expression *)&((Throw *)__range4_3)->operands;
    while ((__begin4.parent != pAVar5 ||
           ((ExpressionList *)child != &((Throw *)__range4_3)->operands))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar5 = *(ArenaVector<wasm::Expression_*> **)(__begin4.index + 0x28);
    child = (Expression *)pEVar35;
    while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != pEVar35))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    goto LAB_0089d782;
  case RethrowId:
    pRVar25 = Expression::cast<wasm::Rethrow>(left);
    pRVar26 = Expression::cast<wasm::Rethrow>(right);
    sVar102 = (pRVar25->target).super_IString.str._M_len;
    pcVar100 = (pRVar25->target).super_IString.str._M_str;
    pcVar98 = (pRVar26->target).super_IString.str._M_str;
LAB_0089c52e:
    left_00.super_IString.str._M_str = pcVar100;
    left_00.super_IString.str._M_len = sVar102;
    right_01.super_IString.str._M_str = in_R8;
    right_01.super_IString.str._M_len = (size_t)pcVar98;
    bVar7 = compareNames(wasm::Name,wasm::Name_(this,left_00,right_01);
    if (bVar7) {
      return true;
    }
    break;
  case ThrowRefId:
    pRVar21 = (RefTest *)Expression::cast<wasm::ThrowRef>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::ThrowRef>(right);
    goto LAB_0089cb59;
  case TupleMakeId:
    pTVar85 = Expression::cast<wasm::TupleMake>(left);
    pTVar86 = Expression::cast<wasm::TupleMake>(right);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pTVar85->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (pTVar86->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      __begin4.index = (size_t)&pTVar86->operands;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pTVar85->operands;
      while ((sVar102 = __begin4.index, __begin4.parent != pAVar5 ||
             ((ExpressionList *)child != &pTVar85->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      child = (Expression *)__begin4.index;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = (ArenaVector<wasm::Expression_*> *)
               (pTVar86->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      while ((__begin4.parent != pAVar5 || (child != (Expression *)sVar102))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      return true;
    }
    break;
  case TupleExtractId:
    pTVar38 = Expression::cast<wasm::TupleExtract>(left);
    pTVar39 = Expression::cast<wasm::TupleExtract>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pTVar38->tuple);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pTVar39->tuple);
    if (pTVar38->index == pTVar39->index) {
      return true;
    }
    break;
  case RefI31Id:
    pRVar21 = (RefTest *)Expression::cast<wasm::RefI31>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::RefI31>(right);
    goto LAB_0089cb59;
  case I31GetId:
    pIVar56 = Expression::cast<wasm::I31Get>(left);
    pIVar57 = Expression::cast<wasm::I31Get>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pIVar56->i31);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pIVar57->i31);
    if (pIVar56->signed_ == pIVar57->signed_) {
      return true;
    }
    break;
  case CallRefId:
    pCVar23 = Expression::cast<wasm::CallRef>(left);
    pCVar24 = Expression::cast<wasm::CallRef>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pCVar23->target);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pCVar24->target);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pCVar23->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (pCVar24->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      __begin4.index = (size_t)&pCVar24->operands;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pCVar23->operands;
      while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pCVar23->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      child = (Expression *)__begin4.index;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = (ArenaVector<wasm::Expression_*> *)
               (pCVar24->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      while ((__begin4.parent != pAVar5 || (child != (Expression *)__begin4.index))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      if (pCVar23->isReturn == pCVar24->isReturn) {
        return true;
      }
    }
    break;
  case RefTestId:
    pRVar21 = Expression::cast<wasm::RefTest>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::RefTest>(right);
    if ((Expression *)(pRVar21->castType).id != pAVar22->destIndex) {
      return false;
    }
    goto LAB_0089cb59;
  case RefCastId:
    pRVar21 = (RefTest *)Expression::cast<wasm::RefCast>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::RefCast>(right);
    goto LAB_0089cb59;
  case BrOnId:
    pBVar60 = Expression::cast<wasm::BrOn>(left);
    pBVar61 = Expression::cast<wasm::BrOn>(right);
    if (pBVar60->op != pBVar61->op) {
      return false;
    }
    right_04.super_IString.str._M_str = in_R8;
    right_04.super_IString.str._M_len = (size_t)(pBVar61->name).super_IString.str._M_str;
    bVar7 = compareNames(wasm::Name,wasm::Name_
                      (this,(Name)(pBVar60->name).super_IString.str,right_04);
    if (!bVar7) {
      return false;
    }
    if ((pBVar60->castType).id != (pBVar61->castType).id) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pBVar60->ref);
    ppEVar12 = &pBVar61->ref;
    goto LAB_0089d274;
  case StructNewId:
    pSVar58 = Expression::cast<wasm::StructNew>(left);
    pSVar59 = Expression::cast<wasm::StructNew>(right);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pSVar58->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (pSVar59->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      __begin4.index = (size_t)&pSVar59->operands;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pSVar58->operands;
      while ((sVar102 = __begin4.index, __begin4.parent != pAVar5 ||
             ((ExpressionList *)child != &pSVar58->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      child = (Expression *)__begin4.index;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = (ArenaVector<wasm::Expression_*> *)
               (pSVar59->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      while ((__begin4.parent != pAVar5 || (child != (Expression *)sVar102))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      return true;
    }
    break;
  case StructGetId:
    pSVar66 = Expression::cast<wasm::StructGet>(left);
    pSVar67 = Expression::cast<wasm::StructGet>(right);
    if (pSVar66->index == pSVar67->index) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),&pSVar66->ref);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),&pSVar67->ref);
      if ((pSVar66->signed_ == pSVar67->signed_) && (pSVar66->order == pSVar67->order)) {
        return true;
      }
    }
    break;
  case StructSetId:
    pSVar54 = (StructRMW *)Expression::cast<wasm::StructSet>(left);
    pSVar55 = (StructRMW *)Expression::cast<wasm::StructSet>(right);
    if (pSVar54->op != pSVar55->op) {
      return false;
    }
    goto LAB_0089c821;
  case StructRMWId:
    pSVar54 = Expression::cast<wasm::StructRMW>(left);
    pSVar55 = Expression::cast<wasm::StructRMW>(right);
    if (pSVar54->op != pSVar55->op) {
      return false;
    }
    if (pSVar54->index != pSVar55->index) {
      return false;
    }
LAB_0089c821:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar54->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar55->value);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar54->ref);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar55->ref);
    if (pSVar54->order == pSVar55->order) {
      return true;
    }
    break;
  case StructCmpxchgId:
    pSVar17 = Expression::cast<wasm::StructCmpxchg>(left);
    pSVar18 = Expression::cast<wasm::StructCmpxchg>(right);
    if (pSVar17->index == pSVar18->index) {
      pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,&pSVar17->replacement);
      pvVar101 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar101,&pSVar18->replacement);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,&pSVar17->expected);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar101,&pSVar18->expected);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,&pSVar17->ref);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar101,&pSVar18->ref);
      if (pSVar17->order == pSVar18->order) {
        return true;
      }
    }
    break;
  case ArrayNewId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::ArrayNew>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::ArrayNew>(right);
    goto LAB_0089d104;
  case ArrayNewDataId:
    pAVar36 = (ArrayInitData *)Expression::cast<wasm::ArrayNewData>(left);
    pAVar37 = (ArrayInitData *)Expression::cast<wasm::ArrayNewData>(right);
    goto LAB_0089c61e;
  case ArrayNewElemId:
    pAVar36 = (ArrayInitData *)Expression::cast<wasm::ArrayNewElem>(left);
    pAVar37 = (ArrayInitData *)Expression::cast<wasm::ArrayNewElem>(right);
LAB_0089c61e:
    if ((pAVar36->segment).super_IString.str._M_str != (pAVar37->segment).super_IString.str._M_str)
    {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar36->index);
LAB_0089c643:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar37->index);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar36->ref);
    ppEVar12 = &pAVar37->ref;
    goto LAB_0089d274;
  case ArrayNewFixedId:
    pAVar89 = Expression::cast<wasm::ArrayNewFixed>(left);
    pAVar90 = Expression::cast<wasm::ArrayNewFixed>(right);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pAVar89->values).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (pAVar90->values).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      __begin4.index = (size_t)&pAVar90->values;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pAVar89->values;
      while ((sVar102 = __begin4.index, __begin4.parent != pAVar5 ||
             ((ExpressionList *)child != &pAVar89->values))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      child = (Expression *)__begin4.index;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = (ArenaVector<wasm::Expression_*> *)
               (pAVar90->values).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      while ((__begin4.parent != pAVar5 || (child != (Expression *)sVar102))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      return true;
    }
    break;
  case ArrayGetId:
    pSVar15 = (SIMDReplace *)Expression::cast<wasm::ArrayGet>(left);
    pSVar16 = (SIMDReplace *)Expression::cast<wasm::ArrayGet>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar15->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar16->vec);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&pSVar15->op);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&pSVar16->op);
    goto LAB_0089bea1;
  case ArraySetId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::ArraySet>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::ArraySet>(right);
    goto LAB_0089d133;
  case ArrayLenId:
    pRVar21 = (RefTest *)Expression::cast<wasm::ArrayLen>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::ArrayLen>(right);
    goto LAB_0089cb59;
  case ArrayCopyId:
    pAVar80 = Expression::cast<wasm::ArrayCopy>(left);
    pAVar22 = Expression::cast<wasm::ArrayCopy>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->length);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar22->length);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->srcIndex);
    goto LAB_0089d21f;
  case ArrayFillId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::ArrayFill>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::ArrayFill>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->srcIndex);
LAB_0089d21f:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar22->srcIndex);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->srcRef);
    goto LAB_0089d237;
  case ArrayInitDataId:
    pAVar36 = Expression::cast<wasm::ArrayInitData>(left);
    pAVar37 = Expression::cast<wasm::ArrayInitData>(right);
    goto LAB_0089c0e2;
  case ArrayInitElemId:
    pAVar36 = (ArrayInitData *)Expression::cast<wasm::ArrayInitElem>(left);
    pAVar37 = (ArrayInitData *)Expression::cast<wasm::ArrayInitElem>(right);
LAB_0089c0e2:
    if ((pAVar36->segment).super_IString.str._M_str != (pAVar37->segment).super_IString.str._M_str)
    {
      return false;
    }
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pAVar36->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar37->size);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pAVar36->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar37->offset);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,&pAVar36->index);
    goto LAB_0089c643;
  case RefAsId:
    pRVar33 = Expression::cast<wasm::RefAs>(left);
    pSVar14 = (StringNew *)Expression::cast<wasm::RefAs>(right);
    goto LAB_0089cf35;
  case StringNewId:
    pSVar13 = Expression::cast<wasm::StringNew>(left);
    pSVar14 = Expression::cast<wasm::StringNew>(right);
    goto LAB_0089d312;
  case StringConstId:
    pGVar87 = (GlobalGet *)Expression::cast<wasm::StringConst>(left);
    pGVar88 = (GlobalGet *)Expression::cast<wasm::StringConst>(right);
LAB_0089d382:
    if ((pGVar87->name).super_IString.str._M_str == (pGVar88->name).super_IString.str._M_str) {
      return true;
    }
    break;
  case StringMeasureId:
    pRVar33 = (RefAs *)Expression::cast<wasm::StringMeasure>(left);
    pSVar14 = (StringNew *)Expression::cast<wasm::StringMeasure>(right);
LAB_0089cf35:
    if (pRVar33->op != pSVar14->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar33->value);
LAB_0089d366:
    ppEVar12 = &pSVar14->ref;
    goto LAB_0089d274;
  case StringEncodeId:
    pSVar13 = (StringNew *)Expression::cast<wasm::StringEncode>(left);
    pSVar14 = (StringNew *)Expression::cast<wasm::StringEncode>(right);
LAB_0089d312:
    if (pSVar13->op != pSVar14->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar13->end);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar14->end);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar13->start);
LAB_0089d34b:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar14->start);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar13->ref);
    goto LAB_0089d366;
  case StringConcatId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::StringConcat>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::StringConcat>(right);
    goto LAB_0089d104;
  case StringEqId:
    pSVar13 = (StringNew *)Expression::cast<wasm::StringEq>(left);
    pSVar14 = (StringNew *)Expression::cast<wasm::StringEq>(right);
    if (pSVar13->op != pSVar14->op) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar13->start);
    goto LAB_0089d34b;
  case StringWTF16GetId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::StringWTF16Get>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::StringWTF16Get>(right);
LAB_0089d104:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->destIndex);
    goto LAB_0089d24f;
  case StringSliceWTFId:
    pAVar80 = (ArrayCopy *)Expression::cast<wasm::StringSliceWTF>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::StringSliceWTF>(right);
LAB_0089d133:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->srcRef);
LAB_0089d237:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar22->srcRef);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->destIndex);
LAB_0089d24f:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pAVar22->destIndex);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pAVar80->destRef);
    goto LAB_0089d26a;
  case ContNewId:
    pRVar21 = (RefTest *)Expression::cast<wasm::ContNew>(left);
    pAVar22 = (ArrayCopy *)Expression::cast<wasm::ContNew>(right);
LAB_0089cb59:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pRVar21->ref);
LAB_0089d26a:
    ppEVar12 = &pAVar22->destRef;
LAB_0089d274:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),ppEVar12);
LAB_0089d392:
    return true;
  case ContBindId:
    pCVar19 = Expression::cast<wasm::ContBind>(left);
    pCVar20 = Expression::cast<wasm::ContBind>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pCVar19->cont);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pCVar20->cont);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pCVar19->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (pCVar20->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      __begin4.index = (size_t)&pCVar20->operands;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pCVar19->operands;
      while ((sVar102 = __begin4.index, __begin4.parent != pAVar5 ||
             ((ExpressionList *)child != &pCVar19->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      child = (Expression *)__begin4.index;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = (ArenaVector<wasm::Expression_*> *)
               (pCVar20->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      while ((__begin4.parent != pAVar5 || (child != (Expression *)sVar102))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      return true;
    }
    break;
  case SuspendId:
    __range4_3 = (ExpressionList *)Expression::cast<wasm::Suspend>(left);
    __begin4.index = (size_t)Expression::cast<wasm::Suspend>(right);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (((Suspend *)__range4_3)->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 != (ArenaVector<wasm::Expression_*> *)
                  (((Suspend *)__begin4.index)->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      return false;
    }
    pEVar35 = &((Suspend *)__begin4.index)->operands;
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    child = (Expression *)&((Suspend *)__range4_3)->operands;
    while ((__begin4.parent != pAVar5 ||
           ((ExpressionList *)child != &((Suspend *)__range4_3)->operands))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar5 = *(ArenaVector<wasm::Expression_*> **)(__begin4.index + 0x28);
    child = (Expression *)pEVar35;
    while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != pEVar35))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
LAB_0089d782:
    pMVar91 = __range4_3->allocator;
LAB_0089d78e:
    if (pMVar91 == (MixedArena *)(((ResumeThrow *)__begin4.index)->tag).super_IString.str._M_str) {
      return true;
    }
    break;
  case ResumeId:
    pRVar8 = Expression::cast<wasm::Resume>(left);
    pRVar9 = Expression::cast<wasm::Resume>(right);
    uVar99 = 0;
    if ((pRVar8->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements
        != (pRVar9->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.
           usedElements) {
      return false;
    }
    __begin4.index = (size_t)pRVar8;
    while (sVar102 = __begin4.index, uVar103 = (ulong)uVar99,
          uVar103 < *(ulong *)(__begin4.index + 0x80)) {
      pTVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                          (&(pRVar8->sentTypes).
                            super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,uVar103);
      pTVar84 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                          (&(pRVar9->sentTypes).
                            super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,uVar103);
      uVar99 = uVar99 + 1;
      if (pTVar83->id != pTVar84->id) {
        return false;
      }
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(__begin4.index + 0x70));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar9->cont);
    pAVar5 = *(ArenaVector<wasm::Expression_*> **)(sVar102 + 0x58);
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (pRVar9->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      pEVar2 = (Expression *)(sVar102 + 0x50);
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = pEVar2;
      while ((__begin4.parent != pAVar5 || (child != pEVar2))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = (ArenaVector<wasm::Expression_*> *)
               (pRVar9->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      child = (Expression *)&pRVar9->operands;
      while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pRVar9->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      uVar99 = 0;
      if (*(size_t *)(__begin4.index + 0x38) !=
          (pRVar9->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements) {
        return false;
      }
      pAVar93 = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(__begin4.index + 0x30);
      while (uVar103 = (ulong)uVar99, uVar103 < *(ulong *)(__begin4.index + 0x38)) {
        pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[](pAVar93,uVar103);
        sVar6 = (pNVar94->super_IString).str;
        pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar9->handlerBlocks).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
        right_05.super_IString.str._M_str = in_R8;
        right_05.super_IString.str._M_len = (size_t)(pNVar94->super_IString).str._M_str;
        bVar7 = compareNames(wasm::Name,wasm::Name_(this,(Name)sVar6,right_05);
        uVar99 = uVar99 + 1;
        if (!bVar7) {
          return false;
        }
      }
      uVar99 = 0;
      if (*(size_t *)(__begin4.index + 0x18) ==
          (pRVar9->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements) {
        pAVar93 = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(__begin4.index + 0x10);
        do {
          uVar103 = (ulong)uVar99;
          if (*(ulong *)(__begin4.index + 0x18) <= uVar103) {
            return true;
          }
          pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                              (pAVar93,uVar103);
          pNVar96 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                              (&(pRVar9->handlerTags).
                                super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
          uVar99 = uVar99 + 1;
        } while ((pNVar94->super_IString).str._M_str == (pNVar96->super_IString).str._M_str);
        return false;
      }
      return false;
    }
    break;
  case ResumeThrowId:
    pRVar81 = Expression::cast<wasm::ResumeThrow>(left);
    pRVar82 = Expression::cast<wasm::ResumeThrow>(right);
    uVar99 = 0;
    if ((pRVar81->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements
        != (pRVar82->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.
           usedElements) {
      return false;
    }
    __begin4.index = (size_t)pRVar81;
    while (sVar102 = __begin4.index, uVar103 = (ulong)uVar99,
          uVar103 < *(ulong *)(__begin4.index + 0x90)) {
      pTVar83 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                          (&(pRVar81->sentTypes).
                            super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,uVar103);
      pTVar84 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::operator[]
                          (&(pRVar82->sentTypes).
                            super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,uVar103);
      uVar99 = uVar99 + 1;
      if (pTVar83->id != pTVar84->id) {
        return false;
      }
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(__begin4.index + 0x80));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pRVar82->cont);
    pAVar5 = *(ArenaVector<wasm::Expression_*> **)(sVar102 + 0x68);
    if (pAVar5 != (ArenaVector<wasm::Expression_*> *)
                  (pRVar82->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      return false;
    }
    pEVar2 = (Expression *)(sVar102 + 0x60);
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    child = pEVar2;
    while ((__begin4.parent != pAVar5 || (child != pEVar2))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pRVar82->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    child = (Expression *)&pRVar82->operands;
    while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pRVar82->operands))) {
      ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator*((Iterator *)&child);
      __range4_15 = (ExpressionList *)*ppEVar12;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&__range4_15);
      __begin4.parent =
           (ArenaVector<wasm::Expression_*> *)
           ((long)&((__begin4.parent)->
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data
           + 1);
    }
    uVar99 = 0;
    if (*(size_t *)(__begin4.index + 0x48) !=
        (pRVar82->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
        usedElements) {
      return false;
    }
    pAVar93 = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(__begin4.index + 0x40);
    while (uVar103 = (ulong)uVar99, uVar103 < *(ulong *)(__begin4.index + 0x48)) {
      pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[](pAVar93,uVar103);
      sVar6 = (pNVar94->super_IString).str;
      pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(pRVar82->handlerBlocks).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
      right_06.super_IString.str._M_str = in_R8;
      right_06.super_IString.str._M_len = (size_t)(pNVar94->super_IString).str._M_str;
      bVar7 = compareNames(wasm::Name,wasm::Name_(this,(Name)sVar6,right_06);
      uVar99 = uVar99 + 1;
      if (!bVar7) {
        return false;
      }
    }
    uVar99 = 0;
    if (*(size_t *)(__begin4.index + 0x28) !=
        (pRVar82->handlerTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
        usedElements) {
      return false;
    }
    pAVar93 = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(__begin4.index + 0x20);
    while (uVar103 = (ulong)uVar99, uVar103 < *(ulong *)(__begin4.index + 0x28)) {
      pNVar94 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[](pAVar93,uVar103);
      pNVar96 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                          (&(pRVar82->handlerTags).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar103);
      uVar99 = uVar99 + 1;
      if ((pNVar94->super_IString).str._M_str != (pNVar96->super_IString).str._M_str) {
        return false;
      }
    }
    pMVar91 = *(MixedArena **)(__begin4.index + 0x18);
    __begin4.index = (size_t)pRVar82;
    goto LAB_0089d78e;
  case StackSwitchId:
    pSVar10 = Expression::cast<wasm::StackSwitch>(left);
    pSVar11 = Expression::cast<wasm::StackSwitch>(right);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),&pSVar10->cont);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),&pSVar11->cont);
    pAVar5 = (ArenaVector<wasm::Expression_*> *)
             (pSVar10->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    if (pAVar5 == (ArenaVector<wasm::Expression_*> *)
                  (pSVar11->operands).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements) {
      __begin4.index = (size_t)&pSVar11->operands;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      child = (Expression *)&pSVar10->operands;
      while ((__begin4.parent != pAVar5 || ((ExpressionList *)child != &pSVar10->operands))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x30),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      child = (Expression *)__begin4.index;
      __begin4.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar5 = (ArenaVector<wasm::Expression_*> *)
               (pSVar11->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      while ((__begin4.parent != pAVar5 || (child != (Expression *)__begin4.index))) {
        ppEVar12 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)&child);
        __range4_15 = (ExpressionList *)*ppEVar12;
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   ((long)this + 0x48),(value_type *)&__range4_15);
        __begin4.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin4.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      if ((pSVar10->tag).super_IString.str._M_str == (pSVar11->tag).super_IString.str._M_str) {
        return true;
      }
    }
    break;
  default:
    goto LAB_0089d392;
  }
  return false;
}

Assistant:

bool compareNodes(Expression* left, Expression* right) {
      if (left->_id != right->_id) {
        return false;
      }

#define DELEGATE_ID left->_id

// Create cast versions of it for later operations.
#define DELEGATE_START(id)                                                     \
  [[maybe_unused]] auto* castLeft = left->cast<id>();                          \
  [[maybe_unused]] auto* castRight = right->cast<id>();

// Handle each type of field, comparing it appropriately.
#define DELEGATE_FIELD_CHILD(id, field)                                        \
  leftStack.push_back(castLeft->field);                                        \
  rightStack.push_back(castRight->field);

#define DELEGATE_FIELD_CHILD_VECTOR(id, field)                                 \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (auto* child : castLeft->field) {                                        \
    leftStack.push_back(child);                                                \
  }                                                                            \
  for (auto* child : castRight->field) {                                       \
    rightStack.push_back(child);                                               \
  }

#define COMPARE_FIELD(field)                                                   \
  if (castLeft->field != castRight->field) {                                   \
    return false;                                                              \
  }

#define DELEGATE_FIELD_INT(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_LITERAL(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_NAME(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_TYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_HEAPTYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_ADDRESS(id, field) COMPARE_FIELD(field)

#define COMPARE_LIST(field)                                                    \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (castLeft->field[i] != castRight->field[i]) {                           \
      return false;                                                            \
    }                                                                          \
  }

#define DELEGATE_FIELD_INT_ARRAY(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_INT_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_TYPE_VECTOR(id, field) COMPARE_LIST(field)

#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)                               \
  if (castLeft->field.is() != castRight->field.is()) {                         \
    return false;                                                              \
  }                                                                            \
  rightNames[castLeft->field] = castRight->field;

#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)                               \
  if (!compareNames(castLeft->field, castRight->field)) {                      \
    return false;                                                              \
  }

#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)                        \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (!compareNames(castLeft->field[i], castRight->field[i])) {              \
      return false;                                                            \
    }                                                                          \
  }

#include "wasm-delegations-fields.def"

      return true;
    }